

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# document.h
# Opt level: O1

bool __thiscall
rapidjson::
GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
::String(GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
         *this,Ch *str,SizeType length,bool copy)

{
  MemoryPoolAllocator<rapidjson::CrtAllocator> *allocator;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *this_00;
  SizeType *pSVar1;
  long lVar2;
  undefined7 in_register_00000009;
  Ch *pCVar3;
  StringRefType local_28;
  
  lVar2 = (long)(this->stack_).stackEnd_ - (long)(this->stack_).stackTop_;
  if ((int)CONCAT71(in_register_00000009,copy) == 0) {
    if (lVar2 < 0x10) {
      internal::Stack<rapidjson::CrtAllocator>::
      Expand<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                (&this->stack_,1);
    }
    pSVar1 = (SizeType *)(this->stack_).stackTop_;
    (this->stack_).stackTop_ = (char *)(pSVar1 + 4);
    pSVar1[0] = 0;
    pSVar1[1] = 0;
    pSVar1[2] = 0;
    pSVar1[3] = 0;
    pCVar3 = "";
    if (str != (Ch *)0x0) {
      pCVar3 = str;
    }
    *(ulong *)(pSVar1 + 2) = (ulong)pCVar3 | 0x405000000000000;
    *pSVar1 = length;
  }
  else {
    if (lVar2 < 0x10) {
      internal::Stack<rapidjson::CrtAllocator>::
      Expand<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                (&this->stack_,1);
    }
    allocator = this->allocator_;
    this_00 = (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)(this->stack_).stackTop_;
    (this->stack_).stackTop_ = (char *)(this_00 + 1);
    local_28.s = "";
    if (str != (Ch *)0x0) {
      local_28.s = str;
    }
    (this_00->data_).n = (Number)0x0;
    (this_00->data_).s.str = (Ch *)0x0;
    local_28.length = length;
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    SetStringRaw(this_00,&local_28,allocator);
  }
  return true;
}

Assistant:

bool String(const Ch* str, SizeType length, bool copy) { 
        if (copy) 
            new (stack_.template Push<ValueType>()) ValueType(str, length, GetAllocator());
        else
            new (stack_.template Push<ValueType>()) ValueType(str, length);
        return true;
    }